

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui.h
# Opt level: O2

void __thiscall ImTui::TScreen::resize(TScreen *this,int pnx,int pny)

{
  TCell *pTVar1;
  int iVar2;
  ulong uVar3;
  
  this->nx = pnx;
  this->ny = pny;
  iVar2 = pny * pnx;
  if (this->nmax < iVar2) {
    if (this->data != (TCell *)0x0) {
      operator_delete__(this->data);
      iVar2 = this->ny * this->nx;
    }
    this->nmax = iVar2;
    uVar3 = 0xffffffffffffffff;
    if (-1 < iVar2) {
      uVar3 = (long)iVar2 * 4;
    }
    pTVar1 = (TCell *)operator_new__(uVar3);
    this->data = pTVar1;
  }
  return;
}

Assistant:

inline void resize(int pnx, int pny) {
        nx = pnx;
        ny = pny;
        if (nx*ny <= nmax) return;

        if (data) delete [] data;

        nmax = nx*ny;
        data = new TCell[nmax];
    }